

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

PropertyString * __thiscall
Js::ScriptContext::CreateAndCacheSymbolOrPropertyString<Js::PropertyString>
          (ScriptContext *this,PropertyRecord *propertyRecord)

{
  SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
  *this_00;
  PropertyString *local_30;
  PropertyString *prop;
  
  this_00 = (SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
             *)JavascriptLibrary::EnsurePropertyStringMap
                         ((this->super_ScriptContextBase).javascriptLibrary);
  local_30 = JavascriptLibrary::CreatePropertyString
                       ((this->super_ScriptContextBase).javascriptLibrary,propertyRecord);
  prop._4_4_ = propertyRecord->pid;
  JsUtil::
  SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
  ::
  Insert<(JsUtil::SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>::InsertOperations)2>
            (this_00,(TBKey *)((long)&prop + 4),&local_30);
  return local_30;
}

Assistant:

PropertyString* ScriptContext::CreateAndCacheSymbolOrPropertyString<PropertyString>(const PropertyRecord* propertyRecord)
    {
        // Library doesn't cache PropertyString instances because we might hold them in the 2-letter cache instead.
        PropertyStringCacheMap* propertyMap = this->GetLibrary()->EnsurePropertyStringMap();
        PropertyString* prop = this->GetLibrary()->CreatePropertyString(propertyRecord);
#if ENABLE_WEAK_REFERENCE_REGIONS
        propertyMap->Item(propertyRecord->GetPropertyId(), prop);
#else
        propertyMap->Item(propertyRecord->GetPropertyId(), recycler->CreateWeakReferenceHandle(prop));
#endif
        return prop;
    }